

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O1

int anon_unknown.dwarf_261f2::ChannelOut_programchange(lua_State *L)

{
  long *plVar1;
  ulong uVar2;
  char local_1a;
  undefined1 local_19;
  
  plVar1 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  uVar2 = luaL_checkinteger(L,2);
  if (0x7f < uVar2) {
    luaL_argerror(L,2,"MIDI program number must be between 0 and 127");
  }
  local_1a = (char)plVar1[1] + -0x40;
  local_19 = (undefined1)uVar2;
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),&local_1a,2);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_programchange(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer value = luaL_checkinteger(L, 2);

	luaL_argcheck(L, value >= 0 && value <= 0x7F, 2, "MIDI program number must be between 0 and 127");

	self.send(0xC0 + self.index, value);
	lua_settop(L, 1);
	return 1;
}